

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::EntryPointInfo::DoLazyBailout
          (EntryPointInfo *this,BYTE **addressOfInstructionPointer,BYTE *framePointer,
          FunctionBody *functionBody,PropertyRecord *propertyRecord)

{
  Type p_Var1;
  Type p_Var2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  int32 iVar6;
  NativeEntryPointData *pNVar7;
  undefined4 *puVar8;
  InProcNativeEntryPointData *pIVar9;
  NativeLazyBailOutRecordList *this_00;
  LazyBailOutRecord *pLVar10;
  Type *this_01;
  int index;
  int iVar11;
  int iVar12;
  
  p_Var1 = (Type)*addressOfInstructionPointer;
  pNVar7 = GetNativeEntryPointData(this);
  p_Var2 = pNVar7->nativeAddress;
  if ((p_Var1 <= p_Var2) || (p_Var2 + pNVar7->codeSize <= p_Var1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2259,
                                "(instructionPointer > (BYTE*)nativeAddress && instructionPointer < ((BYTE*)nativeAddress + codeSize))"
                                ,
                                "instructionPointer > (BYTE*)nativeAddress && instructionPointer < ((BYTE*)nativeAddress + codeSize)"
                               );
    if (!bVar4) goto LAB_00773123;
    *puVar8 = 0;
  }
  pIVar9 = (InProcNativeEntryPointData *)GetNativeEntryPointData(this);
  this_00 = InProcNativeEntryPointData::GetSortedLazyBailOutRecordList(pIVar9);
  if (this_00 == (NativeLazyBailOutRecordList *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x225d,"(bailOutRecordList != nullptr)",
                                "Lazy Bailout: bailOutRecordList is missing");
    if (!bVar4) goto LAB_00773123;
    *puVar8 = 0;
  }
  iVar11 = (this_00->super_ReadOnlyList<LazyBailOutRecord,_Memory::HeapAllocator,_DefaultComparer>).
           count + -1;
  if (-1 < iVar11) {
    iVar12 = 0;
    do {
      index = (iVar11 - iVar12) / 2 + iVar12;
      pLVar10 = JsUtil::ReadOnlyList<LazyBailOutRecord,_Memory::HeapAllocator,_DefaultComparer>::
                Item(&this_00->
                      super_ReadOnlyList<LazyBailOutRecord,_Memory::HeapAllocator,_DefaultComparer>,
                     index);
      if ((ulong)((long)p_Var1 - (long)p_Var2) < (ulong)pLVar10->offset) {
        iVar11 = index + -1;
      }
      else {
        if ((long)p_Var1 - (long)p_Var2 == (ulong)pLVar10->offset) {
          if (index != -1) {
            pIVar9 = (InProcNativeEntryPointData *)GetNativeEntryPointData(this);
            this_01 = JsUtil::
                      List<LazyBailOutRecord,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item(this_00,index);
            uVar5 = InProcNativeEntryPointData::GetLazyBailOutThunkOffset(pIVar9);
            *addressOfInstructionPointer = (BYTE *)(p_Var2 + uVar5);
            iVar6 = InProcNativeEntryPointData::GetLazyBailOutRecordSlotOffset(pIVar9);
            *(BailOutRecord **)(framePointer + iVar6) = this_01->bailOutRecord;
            bVar4 = Phases::IsEnabled((Phases *)&DAT_015b6718,LazyBailoutPhase);
            if (!bVar4) {
              return;
            }
            Output::Print(L"On stack lazy bailout. Property: %s Old IP: 0x%x New IP: 0x%x ",
                          propertyRecord + 1,p_Var1,p_Var2 + uVar5);
            LazyBailOutRecord::Dump(this_01,functionBody);
            Output::Print(L"\n");
            return;
          }
          break;
        }
        iVar12 = index + 1;
      }
    } while (iVar12 <= iVar11);
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar8 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,0x2289,"(false)","Lazy Bailout: Address mapping missing");
  if (bVar4) {
    *puVar8 = 0;
    return;
  }
LAB_00773123:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void EntryPointInfo::DoLazyBailout(
        BYTE **addressOfInstructionPointer,
        BYTE *framePointer
#if DBG
        , Js::FunctionBody *functionBody
        , const PropertyRecord *propertyRecord
#endif
    )
    {
        BYTE* instructionPointer = *addressOfInstructionPointer;
        NativeEntryPointData * nativeEntryPointData = this->GetNativeEntryPointData();
        Js::JavascriptMethod nativeAddress = nativeEntryPointData->GetNativeAddress();
        ptrdiff_t codeSize = nativeEntryPointData->GetCodeSize();
        Assert(instructionPointer > (BYTE*)nativeAddress && instructionPointer < ((BYTE*)nativeAddress + codeSize));
        size_t offset = instructionPointer - (BYTE*)nativeAddress;
        NativeLazyBailOutRecordList * bailOutRecordList = this->GetInProcNativeEntryPointData()->GetSortedLazyBailOutRecordList();

        AssertMsg(bailOutRecordList != nullptr, "Lazy Bailout: bailOutRecordList is missing");

        int found = bailOutRecordList->BinarySearch([=](const LazyBailOutRecord& record, int index)
        {
            if (record.offset == offset)
            {
                return 0;
            }
            else if (record.offset > offset)
            {
                return 1;
            }
            else
            {
                return -1;
            }
        });

        if (found != -1)
        {
            auto inProcNativeEntryPointData = this->GetInProcNativeEntryPointData();
            const LazyBailOutRecord& record = bailOutRecordList->Item(found);
            const uint32 lazyBailOutThunkOffset = inProcNativeEntryPointData->GetLazyBailOutThunkOffset();
            BYTE * const lazyBailOutThunkAddress = (BYTE *) nativeAddress + lazyBailOutThunkOffset;

            // Change the instruction pointer of the frame to our thunk so that
            // when execution returns back to this frame, we will execute the thunk instead
            *addressOfInstructionPointer = lazyBailOutThunkAddress;

            // Put the BailOutRecord corresponding to our LazyBailOut point on the pre-allocated slot on the stack
            BYTE *addressOfLazyBailOutRecordSlot = framePointer + inProcNativeEntryPointData->GetLazyBailOutRecordSlotOffset();
            *(reinterpret_cast<intptr_t *>(addressOfLazyBailOutRecordSlot)) = reinterpret_cast<intptr_t>(record.bailOutRecord);
            
            if (PHASE_TRACE1(Js::LazyBailoutPhase))
            {
#if DBG
                Output::Print(_u("On stack lazy bailout. Property: %s Old IP: 0x%x New IP: 0x%x "), propertyRecord->GetBuffer(), instructionPointer, lazyBailOutThunkAddress);
                record.Dump(functionBody);
                Output::Print(_u("\n"));
#endif
            }
        }
        else
        {
            AssertMsg(false, "Lazy Bailout: Address mapping missing");
        }
    }